

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::UnlockAllCoins(CWallet *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool success;
  iterator it;
  WalletBatch batch;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  WalletDatabase *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  COutPoint *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  byte bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT17(in_stack_ffffffffffffffaf,
                              CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),
             (char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (AnnotatedMixin<std::recursive_mutex> *)0x1b89e4);
  bVar3 = 1;
  GetDatabase((CWallet *)
              CONCAT17(in_stack_ffffffffffffffaf,
                       CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
  WalletBatch::WalletBatch
            ((WalletBatch *)
             CONCAT17(in_stack_ffffffffffffffaf,
                      CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)),
             in_stack_ffffffffffffffa0,SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::begin
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
             in_stack_ffffffffffffffa0);
  while( true ) {
    std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::end
              ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
               in_stack_ffffffffffffffa0);
    bVar2 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffffaf,
                                              CONCAT16(in_stack_ffffffffffffffae,
                                                       in_stack_ffffffffffffffa8)),
                            (_Self *)in_stack_ffffffffffffffa0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_const_iterator<COutPoint>::operator*
              ((_Rb_tree_const_iterator<COutPoint> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    in_stack_ffffffffffffffaf =
         WalletBatch::EraseLockedUTXO
                   ((WalletBatch *)CONCAT17(bVar3,in_stack_ffffffffffffffc8),
                    in_stack_ffffffffffffffc0);
    bVar3 = (bVar3 & 1 & in_stack_ffffffffffffffaf) != 0;
    std::_Rb_tree_const_iterator<COutPoint>::operator++
              ((_Rb_tree_const_iterator<COutPoint> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::clear
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::UnlockAllCoins()
{
    AssertLockHeld(cs_wallet);
    bool success = true;
    WalletBatch batch(GetDatabase());
    for (auto it = setLockedCoins.begin(); it != setLockedCoins.end(); ++it) {
        success &= batch.EraseLockedUTXO(*it);
    }
    setLockedCoins.clear();
    return success;
}